

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb_details::leaf_node<char,_false>_> * __thiscall
immutable::ref<immutable::rrb_details::leaf_node<char,false>>::operator=
          (ref<immutable::rrb_details::leaf_node<char,false>> *this,
          ref<immutable::rrb_details::internal_node<char,_false>_> *r)

{
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_20;
  ref<immutable::rrb_details::leaf_node<char,_false>_> temp;
  ref<immutable::rrb_details::internal_node<char,_false>_> *r_local;
  ref<immutable::rrb_details::leaf_node<char,_false>_> *this_local;
  
  temp.ptr = (leaf_node<char,_false> *)r;
  ref<immutable::rrb_details::internal_node<char,false>>
            ((ref<immutable::rrb_details::leaf_node<char,false>> *)&local_20,r);
  ref<immutable::rrb_details::leaf_node<char,_false>_>::swap
            ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)this,&local_20);
  ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref(&local_20);
  return (ref<immutable::rrb_details::leaf_node<char,_false>_> *)this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<U>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }